

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void encode_block_intra_and_set_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  TX_SIZE tx_size_00;
  undefined4 in_R8D;
  long in_stack_00000008;
  ENTROPY_CONTEXT *l;
  ENTROPY_CONTEXT *a;
  MACROBLOCK *x;
  encode_b_args *args;
  TX_SIZE in_stack_000000b6;
  BLOCK_SIZE in_stack_000000b7;
  int in_stack_000000b8;
  int in_stack_000000bc;
  int in_stack_000000c0;
  int in_stack_000000c4;
  void *in_stack_000000d0;
  ENTROPY_CONTEXT *in_stack_ffffffffffffffb0;
  int iVar2;
  
  tx_size_00 = (TX_SIZE)((uint)in_ESI >> 0x18);
  iVar2 = in_ECX;
  encode_block_intra(in_stack_000000c4,in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,
                     in_stack_000000b7,in_stack_000000b6,in_stack_000000d0);
  lVar1 = *(long *)(in_stack_00000008 + 0x20) + (long)in_EDX;
  av1_set_txb_context((MACROBLOCK *)(*(long *)(in_stack_00000008 + 0x18) + (long)in_ECX),
                      (int)((ulong)lVar1 >> 0x20),(int)lVar1,tx_size_00,
                      (ENTROPY_CONTEXT *)CONCAT44(iVar2,in_R8D),in_stack_ffffffffffffffb0);
  return;
}

Assistant:

static void encode_block_intra_and_set_context(int plane, int block,
                                               int blk_row, int blk_col,
                                               BLOCK_SIZE plane_bsize,
                                               TX_SIZE tx_size, void *arg) {
  encode_block_intra(plane, block, blk_row, blk_col, plane_bsize, tx_size, arg);

  struct encode_b_args *const args = arg;
  MACROBLOCK *x = args->x;
  ENTROPY_CONTEXT *a = &args->ta[blk_col];
  ENTROPY_CONTEXT *l = &args->tl[blk_row];
  av1_set_txb_context(x, plane, block, tx_size, a, l);
}